

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O3

void dsfmt_chk_init_by_array(dsfmt_t *dsfmt,uint32_t *init_key,int key_length,int mexp)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar3;
  iterator iVar4;
  uint64_t uVar5;
  ulong *puVar6;
  pointer puVar7;
  undefined4 uVar8;
  pointer pvVar9;
  int iVar10;
  long lVar11;
  undefined8 extraout_RAX;
  undefined7 uVar13;
  ostream *poVar12;
  uint *puVar14;
  int extraout_EDX;
  ulong uVar15;
  ulong uVar16;
  long *plVar17;
  uint *puVar18;
  ulong *puVar19;
  ulong uVar20;
  uint32_t *puVar21;
  uint32_t *puVar22;
  int iVar23;
  ulong uVar24;
  double dVar25;
  uint uVar26;
  int iVar27;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  int iVar28;
  uint32_t uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  double dVar36;
  long lVar37;
  dsfmt_t *pdVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uStack_144;
  pointer pvStack_140;
  allocator_type aStack_131;
  ulong uStack_130;
  dsfmt_t *pdStack_128;
  int iStack_11c;
  size_type sStack_118;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  vStack_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_f8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  uint32_t *puStack_c8;
  long lStack_c0;
  ulong uStack_b8;
  vector<bool,_std::allocator<bool>_> vStack_b0;
  long lStack_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_80;
  long lStack_68;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvStack_60;
  long lStack_58;
  pointer pvStack_50;
  
  if (mexp != 0x4de1) {
    dsfmt_chk_init_by_array_cold_1();
    dsfmt->status[2].u[0] = 0x7fefffffffffffff;
    *(undefined8 *)((long)dsfmt->status + 0x28) = 0x7fefffffffffffff;
    vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    iStack_11c = extraout_EDX;
    puStack_c8 = init_key;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&vStack_f8,(ulong)dsfmt->status[0].u32[0],(value_type_conflict2 *)&vStack_b0,
               (allocator_type *)&vStack_110);
    uVar15 = (ulong)dsfmt->status[0].u32[0];
    if (uVar15 == 0) {
      uVar16 = 0;
    }
    else {
      plVar17 = (long *)(dsfmt->status[0xb].u[0] + uVar15 * 0x18 + -0x10);
      uVar16 = 0;
      do {
        uVar24 = *plVar17 - plVar17[-1] >> 3;
        if (uVar16 < uVar24) {
          uVar16 = uVar24;
        }
        plVar17 = plVar17 + -3;
        vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15 - 1] = uVar24;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(&vStack_110,uVar16 + 1,(allocator_type *)&vStack_b0);
    puVar22 = puStack_c8;
    uVar26 = dsfmt->status[0].u32[0] - 1;
    vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar26);
    pdStack_128 = dsfmt;
    if (dsfmt->status[0].u32[0] != 0) {
      do {
        if (vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] != 0) {
          pvVar3 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (vStack_110.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar26]);
          iVar4._M_current = *(uint **)(pvVar3 + 8);
          if (iVar4._M_current == *(uint **)(pvVar3 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(pvVar3,iVar4,(uint *)&vStack_b0);
          }
          else {
            *iVar4._M_current = uVar26;
            *(uint **)(pvVar3 + 8) = iVar4._M_current + 1;
          }
        }
        bVar39 = (int)vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
        uVar26 = (int)vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
        vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             CONCAT44(vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar26);
      } while (bVar39);
    }
    pdVar38 = pdStack_128;
    vStack_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&vStack_b0,pdStack_128->status[1].u[0],(bool *)&vStack_80,
               (allocator_type *)&uStack_144);
    uVar5 = *(uint64_t *)((long)pdVar38->status + 0x188);
    if (pdVar38->status[0x19].u[0] != uVar5) {
      pdVar38->status[0x19].u[0] = uVar5;
    }
    if (uVar16 != 0) {
      pvStack_60 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   ((long)pdVar38->status + 0x188);
      sStack_118 = (size_type)(int)puVar22;
      lStack_68 = sStack_118 * 4 + -4;
      lStack_c0 = 0;
      do {
        lVar11 = (long)vStack_110.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vStack_110.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uStack_130 = uVar16;
        if (lVar11 != 0) {
          pvStack_50 = vStack_110.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16;
          dVar36 = (double)(lVar11 >> 2);
          lVar33 = -(long)dVar36;
          lStack_88 = lVar11 + -4;
          lStack_58 = uVar16 * 3;
LAB_00105047:
          uStack_144 = (pvStack_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar36 + -1];
          uVar15 = vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uStack_144];
          if (uStack_130 <= uVar15) {
            if ((iStack_11c == 2) ||
               ((puVar21 = puVar22, iStack_11c == 1 &&
                ((long)(pdVar38->status[0x19].u[0] - *(long *)((long)pdVar38->status + 0x188)) >> 2
                 == sStack_118)))) {
              this = &vStack_80;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (this,sStack_118,&aStack_131);
              puVar21 = puStack_c8;
              uVar16 = uStack_130;
              if ((int)puVar22 == 0) {
                pvStack_140 = (pointer)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                dVar25 = dVar36;
              }
              else {
                puVar7 = (&((vStack_110.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start)[lStack_58];
                lVar11 = 0;
                do {
                  uVar13 = (undefined7)
                           ((ulong)vStack_f8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 8);
                  if (lVar33 == lVar11) {
                    dVar25 = -NAN;
                    lVar11 = lVar11 + sStack_118;
                    if (lVar11 != 0) goto LAB_0010518a;
                    pvStack_140 = (pointer)CONCAT71(uVar13,1);
                    goto LAB_0010521a;
                  }
                  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         (ulong)(uint)vStack_f8.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [*(uint *)((long)puVar7 + lVar11 * 4 + lStack_88)];
                  iVar10 = (int)lVar11;
                  *(uint *)(CONCAT71(vStack_80.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     vStack_80.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + lStack_68 +
                           lVar11 * 4) =
                       (uint)vStack_f8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [*(uint *)((long)puVar7 + lVar11 * 4 + lStack_88)];
                  lVar11 = lVar11 + -1;
                } while ((int)puVar22 + iVar10 != 1);
                pvStack_140 = (pointer)CONCAT71(uVar13,1);
                dVar25 = (double)(lVar11 - lVar33);
              }
              goto LAB_0010521a;
            }
            goto LAB_00105509;
          }
          pvVar3 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   (vStack_110.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar15);
          iVar4._M_current = *(uint **)(pvVar3 + 8);
          if (iVar4._M_current == *(uint **)(pvVar3 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(pvVar3,iVar4,&uStack_144);
          }
          else {
            *iVar4._M_current = uStack_144;
            *(uint **)(pvVar3 + 8) = iVar4._M_current + 1;
          }
          goto LAB_00105626;
        }
LAB_00105650:
        puVar7 = vStack_110.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar9 = vStack_110.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        if (puVar7 != (pointer)0x0) {
          pvVar9 = vStack_110.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
          vStack_110.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_110.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          operator_delete(puVar7,(long)(pvVar9->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar7);
          pvVar9 = vStack_110.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        vStack_110.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar9;
        uVar16 = uStack_130 - 1;
      } while (uVar16 != 0);
    }
LAB_0010577d:
    if (vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&vStack_110);
    if (vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  memset(dsfmt,0x8b,0xc00);
  iVar10 = 0x2ff;
  if (0x2ff < key_length) {
    iVar10 = key_length;
  }
  *(undefined4 *)((long)dsfmt->status + 0x5e8) = 0xdd4afe5d;
  *(int *)((long)dsfmt->status + 0x614) = key_length + -0x22b501a3;
  dsfmt->status[0].u32[0] = key_length + 0x51bf72d2;
  if (key_length < 1) {
    key_length = 0;
    iVar23 = 1;
  }
  else {
    iVar23 = 1;
    uVar15 = 0;
    do {
      iVar27 = iVar23 + 0x17a >> 0x1f;
      iVar28 = (((uint)((iVar23 + 0x17a) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x17a;
      iVar27 = iVar23 + 0x2ff >> 0x1f;
      uVar26 = dsfmt->status[0].u32[iVar23] ^
               dsfmt->status[0].u32
               [(int)((((uint)((iVar23 + 0x2ff) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 +
                     0x2ff)] ^ dsfmt->status[0].u32[iVar28];
      iVar27 = (uVar26 >> 0x1b ^ uVar26) * 0x19660d;
      dsfmt->status[0].u32[iVar28] = dsfmt->status[0].u32[iVar28] + iVar27;
      uVar29 = init_key[uVar15] + iVar23 + iVar27;
      iVar27 = iVar23 + 0x185 >> 0x1f;
      dsfmt->status[0].u32
      [(int)((((uint)((iVar23 + 0x185) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x185)] =
           dsfmt->status[0].u32
           [(int)((((uint)((iVar23 + 0x185) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x185)
           ] + uVar29;
      dsfmt->status[0].u32[iVar23] = uVar29;
      iVar27 = iVar23 + 1 >> 0x1f;
      iVar23 = iVar23 + (((uint)((iVar23 + 1) / 6 + iVar27) >> 7) - iVar27) * -0x300 + 1;
      uVar15 = uVar15 + 1;
    } while ((uint)key_length != uVar15);
    if (0x2fe < key_length) goto LAB_00104ccb;
  }
  iVar10 = iVar10 - key_length;
  do {
    iVar27 = iVar23 + 0x17a >> 0x1f;
    iVar28 = (((uint)((iVar23 + 0x17a) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x17a;
    iVar27 = iVar23 + 0x2ff >> 0x1f;
    uVar26 = dsfmt->status[0].u32[iVar23] ^
             dsfmt->status[0].u32
             [(int)((((uint)((iVar23 + 0x2ff) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 +
                   0x2ff)] ^ dsfmt->status[0].u32[iVar28];
    iVar27 = (uVar26 >> 0x1b ^ uVar26) * 0x19660d;
    dsfmt->status[0].u32[iVar28] = dsfmt->status[0].u32[iVar28] + iVar27;
    uVar29 = iVar27 + iVar23;
    iVar27 = iVar23 + 0x185 >> 0x1f;
    dsfmt->status[0].u32
    [(int)((((uint)((iVar23 + 0x185) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x185)] =
         dsfmt->status[0].u32
         [(int)((((uint)((iVar23 + 0x185) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x185)]
         + uVar29;
    dsfmt->status[0].u32[iVar23] = uVar29;
    iVar27 = iVar23 + 1 >> 0x1f;
    iVar23 = iVar23 + (((uint)((iVar23 + 1) / 6 + iVar27) >> 7) - iVar27) * -0x300 + 1;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
LAB_00104ccb:
  iVar10 = 0x300;
  do {
    iVar27 = iVar23 + 0x17a >> 0x1f;
    iVar28 = (((uint)((iVar23 + 0x17a) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x17a;
    iVar27 = iVar23 + 0x2ff >> 0x1f;
    uVar26 = dsfmt->status[0].u32[iVar23] + dsfmt->status[0].u32[iVar28] +
             dsfmt->status[0].u32
             [(int)((((uint)((iVar23 + 0x2ff) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 +
                   0x2ff)];
    uVar26 = (uVar26 >> 0x1b ^ uVar26) * 0x5d588b65;
    dsfmt->status[0].u32[iVar28] = dsfmt->status[0].u32[iVar28] ^ uVar26;
    uVar26 = uVar26 - iVar23;
    iVar27 = iVar23 + 0x185 >> 0x1f;
    dsfmt->status[0].u32
    [(int)((((uint)((iVar23 + 0x185) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x185)] =
         dsfmt->status[0].u32
         [(int)((((uint)((iVar23 + 0x185) / 6 + iVar27) >> 7) - iVar27) * -0x300 + iVar23 + 0x185)]
         ^ uVar26;
    dsfmt->status[0].u32[iVar23] = uVar26;
    iVar27 = iVar23 + 1 >> 0x1f;
    iVar23 = iVar23 + (((uint)((iVar23 + 1) / 6 + iVar27) >> 7) - iVar27) * -0x300 + 1;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  lVar11 = 0;
  do {
    puVar1 = (undefined4 *)((long)dsfmt->status + lVar11 * 8);
    uVar26 = puVar1[1];
    uVar8 = puVar1[2];
    uVar35 = puVar1[3];
    puVar2 = (undefined4 *)((long)dsfmt->status + lVar11 * 8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar26 & 0xfffff | 0x3ff00000;
    puVar2[2] = uVar8;
    puVar2[3] = uVar35 & 0xfffff | 0x3ff00000;
    lVar11 = lVar11 + 2;
  } while (lVar11 != 0x17e);
  uVar15 = *(ulong *)((long)dsfmt->status + 0xbf8);
  uVar16 = ((ulong)((uint)uVar15 & 1) | dsfmt->status[0xbf].u[0] & 0x3d84e1ac0dc82880) ^
           0x1000412401080000;
  uVar26 = 0x20;
  do {
    uVar16 = uVar16 >> (sbyte)uVar26 ^ uVar16;
    bVar39 = 1 < uVar26;
    uVar26 = uVar26 >> 1;
  } while (bVar39);
  if ((uVar16 & 1) == 0) {
    *(ulong *)((long)dsfmt->status + 0xbf8) = uVar15 ^ 1;
  }
  dsfmt->idx = 0x17e;
  return;
  while( true ) {
    puVar7 = vStack_110.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           ((long)puVar7 -
            (long)vStack_110.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2);
    iVar10 = (int)lVar11;
    lVar11 = 0;
    while ((long)&(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar11 != 0) {
      iVar23 = (int)lVar11;
      *(int *)(CONCAT71(vStack_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_,
                        vStack_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_) + (long)iVar10 * 4 + -4 +
              lVar11 * 4) =
           (int)vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[puVar7[lVar11 + -1]];
      lVar11 = lVar11 + -1;
      if (iVar10 + iVar23 == 1) {
        dVar25 = (double)((long)this + lVar11);
        pdVar38 = pdStack_128;
        goto LAB_0010521a;
      }
    }
    lVar11 = iVar10 + lVar11;
    pdVar38 = pdStack_128;
    if (lVar11 == 0) break;
LAB_0010518a:
    uVar16 = uVar16 - 1;
    pvStack_140 = (pointer)CONCAT71((int7)((ulong)this >> 8),uVar16 != 0);
    if (uVar16 == 0) {
      pvStack_140 = (pointer)0x0;
      uVar16 = 0;
      break;
    }
  }
LAB_0010521a:
  puVar14 = (uint *)CONCAT71(vStack_80.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,
                             vStack_80.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_1_);
  uVar24 = (long)vStack_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar14 >> 2;
  if ((1 < uVar24) && (1 < uVar24 + 1)) {
    uVar30 = uVar24 + 1 >> 1;
    do {
      uVar31 = uVar30 - 1;
      uVar26 = puVar14[uVar30 - 1];
      uVar20 = uVar30 * 2 - 1;
      uVar32 = uVar31;
      if (uVar20 < uVar24) {
        lVar11 = uVar30 * 2 + -2;
        do {
          uVar35 = puVar14[uVar20];
          uVar30 = uVar20;
          uVar34 = uVar35;
          if ((lVar11 + 2U != uVar24) &&
             (uVar30 = lVar11 + 2U, uVar34 = puVar14[lVar11 + 2], uVar35 < puVar14[lVar11 + 2])) {
            uVar30 = uVar20;
            uVar34 = uVar35;
          }
          if (uVar26 <= uVar34) break;
          puVar14[uVar32] = uVar34;
          lVar11 = uVar30 * 2;
          uVar20 = uVar30 * 2 + 1;
          uVar32 = uVar30;
        } while (uVar20 < uVar24);
      }
      puVar14[uVar32] = uVar26;
      uVar30 = uVar31;
    } while (uVar31 != 0);
  }
  if ((char)pvStack_140 != '\0') {
    if (dVar25 != 0.0) {
      puVar7 = vStack_110.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (uVar16 <= *puVar14) goto LAB_0010545e;
        uVar30 = vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[puVar7[(long)dVar25 + -1]];
        if (*puVar14 < uVar30) {
          if (uVar24 < 2) {
            uVar20 = 0;
          }
          else {
            uVar32 = 1;
            lVar11 = 0;
            uVar20 = 0;
            do {
              uVar26 = puVar14[uVar32];
              uVar31 = uVar32;
              uVar35 = uVar26;
              if ((lVar11 + 2U != uVar24) &&
                 (uVar31 = lVar11 + 2U, uVar35 = puVar14[lVar11 + 2], uVar26 < puVar14[lVar11 + 2]))
              {
                uVar31 = uVar32;
                uVar35 = uVar26;
              }
              if (uVar30 <= uVar35) break;
              puVar14[uVar20] = uVar35;
              lVar11 = uVar31 * 2;
              uVar32 = uVar31 * 2 + 1;
              uVar20 = uVar31;
            } while (uVar32 < uVar24);
          }
          puVar14[uVar20] = (uint)uVar30;
          pdVar38 = pdStack_128;
        }
        dVar25 = (double)((long)dVar25 + -1);
      } while (dVar25 != 0.0);
    }
    uVar16 = uVar16 - 1;
    if (uVar16 != 0) {
      pvStack_140 = vStack_110.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      do {
        puVar7 = vStack_110.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = (long)vStack_110.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar7;
        if (lVar11 != 0) {
          lVar11 = lVar11 >> 2;
          do {
            if (uVar16 <= *puVar14) goto LAB_0010545e;
            uVar30 = vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[puVar7[lVar11 + -1]];
            if (*puVar14 < uVar30) {
              if (uVar24 < 2) {
                uVar20 = 0;
              }
              else {
                uVar32 = 1;
                lVar37 = 0;
                uVar20 = 0;
                do {
                  uVar26 = puVar14[uVar32];
                  uVar31 = uVar32;
                  uVar35 = uVar26;
                  if ((lVar37 + 2U != uVar24) &&
                     (uVar31 = lVar37 + 2U, uVar35 = puVar14[lVar37 + 2],
                     uVar26 < puVar14[lVar37 + 2])) {
                    uVar31 = uVar32;
                    uVar35 = uVar26;
                  }
                  if (uVar30 <= uVar35) break;
                  puVar14[uVar20] = uVar35;
                  lVar37 = uVar31 * 2;
                  uVar32 = uVar31 * 2 + 1;
                  uVar20 = uVar31;
                } while (uVar32 < uVar24);
              }
              puVar14[uVar20] = (uint)uVar30;
              pdVar38 = pdStack_128;
            }
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
  }
LAB_0010545e:
  lVar11 = 0;
  for (puVar18 = puVar14;
      puVar18 !=
      vStack_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
    lVar11 = lVar11 + (ulong)*puVar18;
  }
  lVar11 = lVar11 + lStack_c0;
  auVar40._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar40._0_8_ = lVar11;
  auVar40._12_4_ = 0x45300000;
  uVar5 = pdVar38->status[1].u[0];
  auVar41._8_4_ = (int)(uVar5 >> 0x20);
  auVar41._0_8_ = uVar5;
  auVar41._12_4_ = 0x45300000;
  dVar25 = ((double)pdVar38->status[0].u32[0] *
           ((auVar40._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0))) /
           ((auVar41._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
  pdVar38->status[2].d[0] = dVar25;
  if (dVar25 < *(double *)((long)pdVar38->status + 0x28)) {
    *(double *)((long)pdVar38->status + 0x28) = dVar25;
  }
  uStack_e0 = dVar36;
  uStack_b8 = uVar15;
  if (puVar14 != (uint *)0x0) {
    operator_delete(puVar14,(long)vStack_80.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar14)
    ;
  }
LAB_00105509:
  iVar4._M_current = *(uint **)(pdVar38->status + 0x19);
  if (sStack_118 <= (ulong)((long)iVar4._M_current - *(long *)((long)pdVar38->status + 0x188) >> 2))
  {
    uVar26 = pdVar38->status[0].u32[0];
    uStack_e0 = (double)pdVar38->status[1].u[0];
    uStack_d8 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
    uStack_e0 = ((double)uVar26 *
                (((double)CONCAT44(0x45300000,(int)((ulong)lStack_c0 >> 0x20)) -
                 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lStack_c0) - 4503599627370496.0))) /
                (((double)CONCAT44(0x45300000,uStack_e0._4_4_) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(undefined4)uStack_e0) - 4503599627370496.0));
    poVar12 = std::ostream::_M_insert<double>(uStack_e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", min-bound: ",0xd);
    poVar12 = std::ostream::_M_insert<double>(*(double *)((long)pdVar38->status + 0x28));
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", last-bound: ",0xe);
    poVar12 = std::ostream::_M_insert<double>(pdVar38->status[2].d[0]);
    vStack_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&vStack_80,1);
    goto LAB_0010577d;
  }
  if (iVar4._M_current == *(uint **)((long)pdVar38->status + 0x198)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (pvStack_60,iVar4,&uStack_144);
  }
  else {
    *iVar4._M_current = uStack_144;
    pdVar38->status[0x19].u[0] = (uint64_t)(iVar4._M_current + 1);
  }
  lStack_c0 = lStack_c0 + uVar15;
  uVar15 = (ulong)uStack_144;
  vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar15] = 0;
  puVar19 = *(ulong **)(pdVar38->status[0xb].u[0] + uVar15 * 0x18);
  puVar6 = *(ulong **)(pdVar38->status[0xb].u[0] + 8 + uVar15 * 0x18);
  puVar22 = puVar21;
  if (puVar19 != puVar6) {
    lVar11 = *(long *)((long)pdVar38->status + 200);
    do {
      uVar15 = *puVar19;
      uVar16 = uVar15 + 0x3f;
      if (-1 < (long)uVar15) {
        uVar16 = uVar15;
      }
      uVar24 = (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001);
      if ((vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[((long)uVar16 >> 6) + (uVar24 - 1)] >>
           (uVar15 & 0x3f) & 1) == 0) {
        vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)uVar16 >> 6) + (uVar24 - 1)] =
             vStack_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar16 >> 6) + (uVar24 - 1)] |
             1L << ((byte)uVar15 & 0x3f);
        puVar18 = *(uint **)(lVar11 + 8 + uVar15 * 0x18);
        for (puVar14 = *(uint **)(lVar11 + uVar15 * 0x18); puVar14 != puVar18; puVar14 = puVar14 + 1
            ) {
          if (vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[*puVar14] != 0) {
            vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[*puVar14] =
                 vStack_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[*puVar14] - 1;
          }
        }
      }
      puVar19 = puVar19 + 1;
      puVar22 = puStack_c8;
    } while (puVar19 != puVar6);
  }
LAB_00105626:
  dVar36 = (double)((long)dVar36 + -1);
  lVar33 = lVar33 + 1;
  lStack_88 = lStack_88 + -4;
  if (dVar36 == 0.0) goto LAB_00105650;
  goto LAB_00105047;
}

Assistant:

void dsfmt_chk_init_by_array(dsfmt_t* dsfmt, uint32_t init_key[],
                             int key_length, int mexp)
{
	int i, j, count;
	uint32_t r;
	uint32_t* psfmt32;
	int lag;
	int mid;
	int size = (DSFMT_N + 1) * 4; /* pulmonary */

	/* make sure caller program is compiled with the same MEXP */
	if (mexp != dsfmt_mexp)
	{
		fprintf(stderr, "DSFMT_MEXP doesn't match with dSFMT.c\n");
		exit(1);
	}
	if (size >= 623)
	{
		lag = 11;
	}
	else if (size >= 68)
	{
		lag = 7;
	}
	else if (size >= 39)
	{
		lag = 5;
	}
	else
	{
		lag = 3;
	}
	mid = (size - lag) / 2;

	psfmt32 = &dsfmt->status[0].u32[0];
	memset(dsfmt->status, 0x8b, sizeof(dsfmt->status));
	if (key_length + 1 > size)
	{
		count = key_length + 1;
	}
	else
	{
		count = size;
	}
	r = ini_func1(psfmt32[idxof(0)] ^ psfmt32[idxof(mid % size)]
		^ psfmt32[idxof((size - 1) % size)]);
	psfmt32[idxof(mid % size)] += r;
	r += key_length;
	psfmt32[idxof((mid + lag) % size)] += r;
	psfmt32[idxof(0)] = r;
	count--;
	for (i = 1, j = 0; (j < count) && (j < key_length); j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += init_key[j] + i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (; j < count; j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (j = 0; j < size; j++)
	{
		r = ini_func2(psfmt32[idxof(i)]
			+ psfmt32[idxof((i + mid) % size)]
			+ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] ^= r;
		r -= i;
		psfmt32[idxof((i + mid + lag) % size)] ^= r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	initial_mask(dsfmt);
	period_certification(dsfmt);
	dsfmt->idx = DSFMT_N64;
}